

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdfdrivr.c
# Opt level: O3

FT_Error BDF_Face_Init(FT_Stream stream,FT_Face bdfface,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  char cVar1;
  short sVar2;
  short sVar3;
  unsigned_long cur_count;
  bdf_font_t *font;
  void *__src;
  bdf_glyph_t *pbVar4;
  long lVar5;
  FT_Face pFVar6;
  FT_Short FVar7;
  uint uVar8;
  int iVar9;
  int iVar10;
  FT_Error FVar11;
  ulong *puVar12;
  undefined1 *block;
  bdf_property_t *pbVar13;
  FT_String *pFVar14;
  char *pcVar15;
  size_t sVar16;
  size_t sVar17;
  FT_Bitmap_Size *pFVar18;
  ulong uVar19;
  FT_Pointer pvVar20;
  bdf_property_t *pbVar21;
  byte *pbVar22;
  FT_Face pFVar23;
  long lVar24;
  anon_union_8_3_ccdffb78_for_value *paVar25;
  undefined2 *puVar26;
  ushort uVar27;
  size_t __n;
  ulong uVar28;
  long lVar29;
  long lVar30;
  ushort uVar31;
  long lVar32;
  FT_Memory pFVar33;
  FT_Long FVar34;
  long *plVar35;
  bdf_font_t *font_00;
  bool bVar36;
  undefined8 uStack_e8;
  bdf_options_t options;
  size_t local_c8;
  FT_Error error;
  ulong local_a8;
  FT_Stream local_a0;
  long local_98;
  FT_Int local_8c;
  long local_88;
  FT_Memory local_80;
  undefined1 auStack_78 [8];
  _bdf_line_func_t cb;
  char *local_68;
  char *pcStack_60;
  undefined1 *local_58;
  ulong *local_50;
  FT_Memory local_48;
  FT_Error local_40;
  FT_Error local_3c;
  FT_Face pFStack_38;
  FT_Error error_1;
  
  pFVar33 = bdfface->memory;
  pFStack_38 = bdfface;
  local_40 = FT_Stream_Seek(stream,0);
  if (local_40 != 0) {
    return local_40;
  }
  uStack_e8 = 0x100000001;
  options.correct_metrics = 0;
  options.keep_unencoded = 8;
  local_3c = 0;
  local_8c = face_index;
  puVar12 = (ulong *)ft_mem_alloc(pFVar33,0x44078,&local_3c);
  local_48 = pFVar33;
  if (local_3c == 0) {
    puVar12[8] = (ulong)&uStack_e8;
    *(undefined2 *)(puVar12 + 3) = 0x7fff;
    puVar12[0x880e] = stream->size;
    puVar12[0x880d] = (ulong)pFVar33;
    puVar12[0x8809] = 0;
    puVar12[0x880a] = 0;
    puVar12[0x880b] = 0;
    puVar12[0x880c] = (ulong)pFVar33;
    pFVar33 = stream->memory;
    local_c8 = local_c8 & 0xffffffff00000000;
    local_50 = puVar12;
    block = (undefined1 *)ft_mem_realloc(pFVar33,1,0,0x400,(void *)0x0,(FT_Error *)&local_c8);
    if ((int)local_c8 == 0) {
      local_98 = 1;
      auStack_78 = (undefined1  [8])_bdf_parse_start;
      *block = 0;
      sVar16 = 0;
      uVar28 = 0;
      lVar29 = 0;
      iVar10 = 0x100;
      uVar19 = 0x400;
      local_a0 = stream;
      local_80 = pFVar33;
LAB_001f5e8b:
      do {
        local_58 = block;
        local_a8 = uVar19;
        bVar36 = false;
        lVar24 = 0;
        block = local_58;
        sVar17 = uVar28;
        while( true ) {
          if (!bVar36) {
            sVar16 = FT_Stream_TryRead(stream,block + sVar17,local_a8 - sVar17);
            lVar29 = sVar16 + sVar17;
            sVar17 = 0;
            block = local_58;
          }
          pFVar33 = local_80;
          lVar5 = local_98;
          uVar28 = local_a8;
          __n = lVar29 - lVar24;
          if (__n == 0 || lVar29 < lVar24) break;
          if (iVar10 == (char)block[lVar24]) {
            lVar24 = lVar24 + 1;
            iVar10 = 0x100;
            bVar36 = true;
          }
          else {
            pcVar15 = block + lVar24;
            lVar30 = 0;
            lVar32 = lVar24;
            while ((cVar1 = block[lVar32], cVar1 != '\n' && (cVar1 != '\r'))) {
              lVar32 = lVar32 + 1;
              lVar30 = lVar30 + 1;
              stream = local_a0;
              if (lVar29 <= lVar32) goto LAB_001f5fd7;
            }
            block[lVar32] = 0;
            if (((*pcVar15 != '\x1a') && (*pcVar15 != '#')) && (lVar24 < lVar32)) {
              options._8_8_ = sVar17;
              local_88 = lVar29;
              iVar10 = (*(code *)auStack_78)(pcVar15,lVar30,local_98,auStack_78,local_50);
              local_c8 = CONCAT44(local_c8._4_4_,iVar10);
              if (iVar10 == -1) {
                iVar10 = (*(code *)auStack_78)(pcVar15,lVar30,lVar5,auStack_78,local_50);
                local_c8 = CONCAT44(local_c8._4_4_,iVar10);
              }
              lVar29 = local_88;
              block = local_58;
              sVar17 = options._8_8_;
              pFVar33 = local_80;
              if (iVar10 != 0) goto LAB_001f6072;
            }
            local_98 = local_98 + 1;
            block[lVar32] = cVar1;
            lVar24 = lVar32 + 1;
            iVar10 = 0x100;
            if (cVar1 == '\r') {
              iVar10 = 10;
            }
            if (cVar1 == '\n') {
              iVar10 = 0xd;
            }
            bVar36 = true;
            stream = local_a0;
          }
        }
LAB_001f5fd7:
        if (sVar16 == 0) break;
        if (lVar24 != 0) {
          memmove(block,block + lVar24,__n);
          sVar16 = __n;
          lVar29 = lVar24;
          uVar28 = __n;
          uVar19 = local_a8;
          block = local_58;
          goto LAB_001f5e8b;
        }
        if (0xffff < local_a8) {
          local_c8 = CONCAT44(local_c8._4_4_,6);
          break;
        }
        uVar19 = local_a8 * 2;
        local_58 = (undefined1 *)CONCAT44(local_58._4_4_,iVar10);
        local_88 = lVar29;
        block = (undefined1 *)ft_mem_realloc(local_80,1,local_a8,uVar19,block,(FT_Error *)&local_c8)
        ;
        lVar29 = local_88;
        iVar10 = (int)local_58;
      } while ((int)local_c8 == 0);
    }
LAB_001f6072:
    ft_mem_free(pFVar33,block);
    local_3c = (int)local_c8;
    font_00 = (bdf_font_t *)local_50[7];
    if ((int)local_c8 == 0) {
      puVar12 = local_50;
      if (font_00 == (bdf_font_t *)0x0) {
        uVar19 = *local_50;
        if ((uVar19 & 1) != 0) goto LAB_001f66a4;
        local_3c = 3;
        goto LAB_001f60ba;
      }
      if (font_00->spacing != 8) {
        font_00->monowidth = (font_00->bbx).width;
      }
      if (local_50[1] != font_00->unencoded_used + font_00->glyphs_used) {
        font_00->modified = 1;
      }
      if ((font_00->unencoded_used != 0 || font_00->glyphs_used != 0) && (*(int *)local_50[8] != 0))
      {
        sVar2 = (short)local_50[3];
        uVar8 = (int)*(short *)((long)local_50 + 0x1c) - (int)sVar2;
        if (uVar8 != (font_00->bbx).width) {
          (font_00->bbx).width = (unsigned_short)uVar8;
          font_00->modified = 1;
        }
        if ((font_00->bbx).x_offset != sVar2) {
          (font_00->bbx).x_offset = sVar2;
          font_00->modified = 1;
        }
        sVar2 = *(short *)((long)local_50 + 0x1e);
        if ((font_00->bbx).ascent != sVar2) {
          (font_00->bbx).ascent = sVar2;
          font_00->modified = 1;
        }
        sVar3 = (short)local_50[4];
        if ((font_00->bbx).descent != sVar3) {
          (font_00->bbx).descent = sVar3;
          (font_00->bbx).y_offset = -sVar3;
          font_00->modified = 1;
        }
        if ((int)sVar3 + (int)sVar2 != (uint)(font_00->bbx).height) {
          (font_00->bbx).height = (unsigned_short)((int)sVar3 + (int)sVar2);
        }
      }
      uVar19 = *local_50;
      if ((uVar19 & 1) != 0) {
LAB_001f66a4:
        if ((uVar19 & 0x20) == 0) {
          local_3c = 0xb9;
        }
        else {
          local_3c = 0xba;
        }
        goto LAB_001f6096;
      }
      cur_count = font_00->comments_len;
      if (cur_count != 0) {
        pcVar15 = (char *)ft_mem_realloc(font_00->memory,1,cur_count,cur_count + 1,font_00->comments
                                         ,&local_3c);
        font_00 = (bdf_font_t *)local_50[7];
        font_00->comments = pcVar15;
        if (local_3c != 0) goto LAB_001f6096;
        pcVar15[font_00->comments_len] = '\0';
        font_00 = (bdf_font_t *)local_50[7];
        puVar12 = local_50;
      }
    }
    else {
LAB_001f6096:
      bdf_free_font(font_00);
      puVar12 = local_50;
      ft_mem_free(local_48,(void *)local_50[7]);
      puVar12[7] = 0;
LAB_001f60ba:
      font_00 = (bdf_font_t *)0x0;
    }
LAB_001f60bd:
    if ((FT_Memory)puVar12[0x880c] != (FT_Memory)0x0) {
      ft_mem_free((FT_Memory)puVar12[0x880c],(void *)puVar12[0x8809]);
      puVar12[0x880b] = 0;
      puVar12[0x880c] = 0;
      puVar12[0x8809] = 0;
      puVar12[0x880a] = 0;
    }
    pFVar33 = local_48;
    ft_mem_free(local_48,(void *)puVar12[5]);
    puVar12[5] = 0;
    ft_mem_free(pFVar33,puVar12);
  }
  else {
    font_00 = (bdf_font_t *)0x0;
    if (puVar12 != (ulong *)0x0) goto LAB_001f60bd;
  }
  local_40 = local_3c;
  if ((char)local_3c == -0x50) {
    BDF_Face_Done(pFStack_38);
    return 2;
  }
  if (local_3c != 0) {
    return local_3c;
  }
  pFStack_38[1].face_flags = (FT_Long)font_00;
  if ((short)local_8c != 0 && 0 < local_8c) {
    BDF_Face_Done(pFStack_38);
    return 6;
  }
  pFStack_38->num_faces = 1;
  pFStack_38->face_index = 0;
  *(byte *)&pFStack_38->face_flags = (byte)pFStack_38->face_flags | 0x92;
  pbVar13 = bdf_get_font_property(font_00,"SPACING");
  if (((pbVar13 != (bdf_property_t *)0x0) && (pbVar13->format == 1)) &&
     (((byte *)(pbVar13->value).atom != (byte *)0x0 &&
      ((uVar8 = (byte)*(pbVar13->value).atom - 0x43, uVar8 < 0x2b &&
       ((0x40100000401U >> ((ulong)uVar8 & 0x3f) & 1) != 0)))))) {
    *(byte *)&pFStack_38->face_flags = (byte)pFStack_38->face_flags | 4;
  }
  pbVar13 = bdf_get_font_property(font_00,"FAMILY_NAME");
  if ((pbVar13 == (bdf_property_t *)0x0) || ((pbVar13->value).atom == (char *)0x0)) {
    pFStack_38->family_name = (FT_String *)0x0;
  }
  else {
    pFVar14 = (FT_String *)ft_mem_strdup(local_48,(pbVar13->value).atom,&local_40);
    pFStack_38->family_name = pFVar14;
    if (local_40 != 0) {
      return local_40;
    }
  }
  local_3c = 0;
  pFVar33 = pFStack_38->memory;
  font = (bdf_font_t *)pFStack_38[1].face_flags;
  local_68 = (char *)0x0;
  pcStack_60 = (char *)0x0;
  auStack_78 = (undefined1  [8])0x0;
  cb = (_bdf_line_func_t)0x0;
  pFStack_38->style_flags = 0;
  pbVar13 = bdf_get_font_property(font,"SLANT");
  if ((((pbVar13 != (bdf_property_t *)0x0) && (pbVar13->format == 1)) &&
      ((byte *)(pbVar13->value).atom != (byte *)0x0)) &&
     ((uVar8 = (byte)*(pbVar13->value).atom - 0x49, uVar8 < 0x27 &&
      ((0x4100000041U >> ((ulong)uVar8 & 0x3f) & 1) != 0)))) {
    *(byte *)&pFStack_38->style_flags = (byte)pFStack_38->style_flags | 1;
    local_68 = "Italic";
    if ((*(pbVar13->value).atom & 0xdfU) == 0x4f) {
      local_68 = "Oblique";
    }
  }
  pbVar13 = bdf_get_font_property(font,"WEIGHT_NAME");
  if (((pbVar13 != (bdf_property_t *)0x0) && (pbVar13->format == 1)) &&
     (((byte *)(pbVar13->value).atom != (byte *)0x0 &&
      ((byte)(*(pbVar13->value).atom | 0x20U) == 0x62)))) {
    *(byte *)&pFStack_38->style_flags = (byte)pFStack_38->style_flags | 2;
    cb = (_bdf_line_func_t)0x2575a2;
  }
  pbVar13 = bdf_get_font_property(font,"SETWIDTH_NAME");
  if (((((pbVar13 != (bdf_property_t *)0x0) && (pbVar13->format == 1)) &&
       (pcVar15 = (pbVar13->value).atom, pcVar15 != (char *)0x0)) &&
      ((cVar1 = *pcVar15, cVar1 != '\0' && (cVar1 != 'N')))) && (cVar1 != 'n')) {
    pcStack_60 = pcVar15;
  }
  pbVar13 = bdf_get_font_property(font,"ADD_STYLE_NAME");
  if (((pbVar13 != (bdf_property_t *)0x0) && (pbVar13->format == 1)) &&
     ((pFVar23 = (FT_Face)(pbVar13->value).atom, pFVar23 != (FT_Face)0x0 &&
      (((cVar1 = (char)pFVar23->num_faces, cVar1 != '\0' && (cVar1 != 'N')) && (cVar1 != 'n')))))) {
    auStack_78 = (undefined1  [8])pFVar23;
  }
  FVar34 = 0;
  lVar29 = 0;
  do {
    (&local_c8)[lVar29] = 0;
    if (*(char **)(auStack_78 + lVar29 * 8) != (char *)0x0) {
      sVar16 = strlen(*(char **)(auStack_78 + lVar29 * 8));
      (&local_c8)[lVar29] = sVar16;
      FVar34 = FVar34 + sVar16 + 1;
    }
    lVar29 = lVar29 + 1;
  } while (lVar29 != 4);
  if (FVar34 == 0) {
    auStack_78 = (undefined1  [8])0x2569b5;
    local_c8 = 7;
    FVar34 = 8;
  }
  pFVar14 = (FT_String *)ft_mem_alloc(pFVar33,FVar34,&local_3c);
  pFStack_38->style_name = pFVar14;
  if (local_3c != 0) {
    return local_3c;
  }
  lVar29 = 0;
  pFVar23 = pFStack_38;
  do {
    __src = *(void **)(auStack_78 + lVar29 * 8);
    if (__src != (void *)0x0) {
      sVar16 = (&local_c8)[lVar29];
      if (pFVar14 != pFVar23->style_name) {
        *pFVar14 = ' ';
        pFVar14 = pFVar14 + 1;
      }
      memcpy(pFVar14,__src,sVar16);
      if (((lVar29 == 3) || (lVar29 == 0)) && (sVar16 != 0)) {
        sVar17 = 0;
        do {
          if (pFVar14[sVar17] == ' ') {
            pFVar14[sVar17] = '-';
          }
          sVar17 = sVar17 + 1;
        } while (sVar16 != sVar17);
      }
      pFVar14 = pFVar14 + sVar16;
      pFVar23 = pFStack_38;
    }
    pFVar6 = pFStack_38;
    lVar29 = lVar29 + 1;
  } while (lVar29 != 4);
  *pFVar14 = '\0';
  local_40 = local_3c;
  if (local_3c != 0) {
    return local_3c;
  }
  pFStack_38->num_glyphs = font_00->glyphs_size + 1;
  pFStack_38->num_fixed_sizes = 1;
  pFVar18 = (FT_Bitmap_Size *)ft_mem_realloc(local_48,0x20,0,1,(void *)0x0,&local_40);
  pFVar6->available_sizes = pFVar18;
  if (local_40 != 0) {
    return local_40;
  }
  pFVar18->x_ppem = 0;
  pFVar18->y_ppem = 0;
  pFVar18->height = 0;
  pFVar18->width = 0;
  *(undefined4 *)&pFVar18->field_0x4 = 0;
  pFVar18->size = 0;
  lVar29 = font_00->font_ascent;
  if (lVar29 - 0x8000U < 0xffffffffffff0001) {
    bVar36 = lVar29 < 0;
    lVar29 = 0x7fff;
    if (bVar36) {
      lVar29 = -0x7fff;
    }
    font_00->font_ascent = lVar29;
  }
  lVar24 = font_00->font_descent;
  if (lVar24 - 0x8000U < 0xffffffffffff0001) {
    bVar36 = lVar24 < 0;
    lVar24 = 0x7fff;
    if (bVar36) {
      lVar24 = -0x7fff;
    }
    font_00->font_descent = lVar24;
  }
  pFVar18->height = (short)lVar24 + (short)lVar29;
  pbVar13 = bdf_get_font_property(font_00,"AVERAGE_WIDTH");
  if (pbVar13 == (bdf_property_t *)0x0) {
    FVar34 = FT_MulDiv((long)pFVar18->height,2,3);
    FVar7 = (FT_Short)FVar34;
  }
  else {
    FVar7 = 0x7fff;
    if (0xfffffffffff6001c < (pbVar13->value).l - 0x4fff2U) {
      iVar10 = ((int)(pbVar13->value).l + 5) / 10;
      iVar9 = -iVar10;
      if (0 < iVar10) {
        iVar9 = iVar10;
      }
      FVar7 = (FT_Short)iVar9;
    }
  }
  pFVar18->width = FVar7;
  pbVar13 = bdf_get_font_property(font_00,"POINT_SIZE");
  if (pbVar13 == (bdf_property_t *)0x0) {
    uVar19 = font_00->point_size;
    if (uVar19 == 0) {
      FVar34 = (long)pFVar18->width << 6;
    }
    else {
      FVar34 = 0x7fff;
      if (uVar19 < 0x8000) {
        FVar34 = uVar19 << 6;
      }
    }
  }
  else {
    lVar29 = (pbVar13->value).l;
    FVar34 = 0x7fff;
    if (0xfffffffffff5f67a < lVar29 - 0x504c3U) {
      lVar24 = -lVar29;
      if (0 < lVar29) {
        lVar24 = lVar29;
      }
      FVar34 = FT_MulDiv(lVar24,0x70800,0x11a4e);
    }
  }
  pFVar18->size = FVar34;
  pbVar13 = bdf_get_font_property(font_00,"PIXEL_SIZE");
  if (pbVar13 != (bdf_property_t *)0x0) {
    iVar9 = (int)(pbVar13->value).l;
    iVar10 = -iVar9;
    if (0 < iVar9) {
      iVar10 = iVar9;
    }
    uVar19 = 0x1fffc0;
    if (0xffffffffffff0000 < (pbVar13->value).l - 0x8000U) {
      uVar19 = (ulong)(uint)(iVar10 << 6);
    }
    pFVar18->y_ppem = uVar19;
  }
  pbVar13 = bdf_get_font_property(font_00,"RESOLUTION_X");
  paVar25 = &pbVar13->value;
  if (pbVar13 == (bdf_property_t *)0x0) {
    paVar25 = (anon_union_8_3_ccdffb78_for_value *)&font_00->resolution_x;
  }
  lVar29 = paVar25->l;
  if (lVar29 == 0) {
    uVar27 = 0;
  }
  else {
    uVar27 = 0x7fff;
    if (0xffffffffffff0000 < lVar29 - 0x8000U) {
      uVar27 = -(ushort)lVar29;
      if (0 < (int)lVar29) {
        uVar27 = (ushort)lVar29;
      }
    }
  }
  pbVar13 = bdf_get_font_property(font_00,"RESOLUTION_Y");
  paVar25 = &pbVar13->value;
  if (pbVar13 == (bdf_property_t *)0x0) {
    paVar25 = (anon_union_8_3_ccdffb78_for_value *)&font_00->resolution_y;
  }
  uVar19 = paVar25->l;
  if (uVar19 == 0) {
    FVar34 = pFVar18->y_ppem;
    if (FVar34 == 0) {
      FVar34 = pFVar18->size;
      pFVar18->y_ppem = FVar34;
    }
  }
  else {
    if (uVar19 - 0x8000 < 0xffffffffffff0001) {
      FVar34 = pFVar18->y_ppem;
      uVar31 = 0x7fff;
      if (FVar34 == 0) {
        FVar34 = pFVar18->size;
        pFVar18->y_ppem = FVar34;
        uVar28 = 0x7fff;
LAB_001f6870:
        uVar31 = (ushort)uVar28;
        FVar34 = FT_MulDiv(FVar34,uVar28 & 0xffff,0x48);
        pFVar18->y_ppem = FVar34;
      }
    }
    else {
      iVar10 = (int)uVar19;
      uVar28 = (ulong)(uint)-iVar10;
      if (0 < iVar10) {
        uVar28 = uVar19 & 0xffffffff;
      }
      uVar31 = (ushort)uVar28;
      FVar34 = pFVar18->y_ppem;
      if (FVar34 == 0) {
        FVar34 = pFVar18->size;
        pFVar18->y_ppem = FVar34;
        if (iVar10 != 0) goto LAB_001f6870;
        goto LAB_001f689f;
      }
    }
    if ((uVar27 != 0) && (uVar31 != 0)) {
      FVar34 = FT_MulDiv(FVar34,(ulong)uVar27,(ulong)uVar31);
    }
  }
LAB_001f689f:
  pFVar18->x_ppem = FVar34;
  pbVar4 = font_00->glyphs;
  pvVar20 = ft_mem_realloc(local_48,0x10,0,font_00->glyphs_size,(void *)0x0,&local_40);
  pFStack_38[1].style_flags = (FT_Long)pvVar20;
  if (local_40 != 0) {
    return local_40;
  }
  pFStack_38[1].num_fixed_sizes = 0;
  uVar19 = font_00->glyphs_size;
  if (uVar19 != 0) {
    lVar29 = font_00->default_char;
    puVar26 = (undefined2 *)((long)pvVar20 + 8);
    plVar35 = &pbVar4->encoding;
    uVar28 = 0;
    do {
      lVar24 = *plVar35;
      *(long *)(puVar26 + -4) = lVar24;
      *puVar26 = (short)uVar28;
      if ((uVar28 < 0xffffffff) && (lVar24 == lVar29)) {
        pFStack_38[1].num_fixed_sizes = (FT_Int)uVar28;
      }
      uVar28 = uVar28 + 1;
      puVar26 = puVar26 + 8;
      plVar35 = plVar35 + 7;
    } while (uVar19 != uVar28);
  }
  pbVar13 = bdf_get_font_property(font_00,"CHARSET_REGISTRY");
  pbVar21 = bdf_get_font_property(font_00,"CHARSET_ENCODING");
  pFVar23 = pFStack_38;
  pFVar33 = local_48;
  if ((((pbVar21 == (bdf_property_t *)0x0 || pbVar13 == (bdf_property_t *)0x0) ||
       (pbVar13->format != 1)) || (pbVar21->format != 1)) ||
     (((pbVar13->value).atom == (char *)0x0 || ((pbVar21->value).atom == (char *)0x0)))) {
    auStack_78 = (undefined1  [8])pFStack_38;
    cb = (_bdf_line_func_t)0x741444f42;
    FVar11 = FT_CMap_New(&bdf_cmap_class,(FT_Pointer)0x0,(FT_CharMap)auStack_78,
                         (FT_CMap_conflict *)0x0);
    if (pFVar23->num_charmaps == 0) {
      return FVar11;
    }
    pFVar23->charmap = *pFVar23->charmaps;
    return FVar11;
  }
  pvVar20 = ft_mem_strdup(local_48,(pbVar21->value).atom,&local_40);
  pFStack_38[1].num_faces = (FT_Long)pvVar20;
  if (local_40 != 0) {
    return local_40;
  }
  pbVar22 = (byte *)ft_mem_strdup(pFVar33,(pbVar13->value).atom,&local_40);
  pFStack_38[1].face_index = (FT_Long)pbVar22;
  if (local_40 != 0) {
    return local_40;
  }
  if ((((*pbVar22 | 0x20) == 0x69) && ((pbVar22[1] | 0x20) == 0x73)) &&
     ((pbVar22[2] | 0x20) == 0x6f)) {
    pbVar22 = pbVar22 + 3;
    iVar10 = strcmp((char *)pbVar22,"10646");
    if ((iVar10 == 0) ||
       (((iVar10 = strcmp((char *)pbVar22,"8859"), iVar10 == 0 &&
         (*(char *)pFStack_38[1].num_faces == '1')) &&
        (((char *)pFStack_38[1].num_faces)[1] == '\0')))) {
      auStack_78 = (undefined1  [8])pFStack_38;
    }
    else {
      iVar10 = strcmp((char *)pbVar22,"646.1991");
      if (iVar10 != 0) goto LAB_001f6a6e;
      pFVar23 = pFStack_38;
      iVar10 = strcmp((char *)pFStack_38[1].num_faces,"IRV");
      cb = (_bdf_line_func_t)0x0;
      auStack_78 = (undefined1  [8])pFVar23;
      if (iVar10 != 0) goto LAB_001f6a7e;
    }
    cb = (_bdf_line_func_t)0x10003756e6963;
  }
  else {
LAB_001f6a6e:
    auStack_78 = (undefined1  [8])pFStack_38;
    cb = (_bdf_line_func_t)0x0;
  }
LAB_001f6a7e:
  FVar11 = FT_CMap_New(&bdf_cmap_class,(FT_Pointer)0x0,(FT_CharMap)auStack_78,
                       (FT_CMap_conflict *)0x0);
  return FVar11;
}

Assistant:

FT_CALLBACK_DEF( FT_Error )
  BDF_Face_Init( FT_Stream      stream,
                 FT_Face        bdfface,        /* BDF_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    FT_Error       error  = FT_Err_Ok;
    BDF_Face       face   = (BDF_Face)bdfface;
    FT_Memory      memory = FT_FACE_MEMORY( face );

    bdf_font_t*    font = NULL;
    bdf_options_t  options;

    FT_UNUSED( num_params );
    FT_UNUSED( params );


    FT_TRACE2(( "BDF driver\n" ));

    if ( FT_STREAM_SEEK( 0 ) )
      goto Exit;

    options.correct_metrics = 1;   /* FZ XXX: options semantics */
    options.keep_unencoded  = 1;
    options.keep_comments   = 0;
    options.font_spacing    = BDF_PROPORTIONAL;

    error = bdf_load_font( stream, memory, &options, &font );
    if ( FT_ERR_EQ( error, Missing_Startfont_Field ) )
    {
      FT_TRACE2(( "  not a BDF file\n" ));
      goto Fail;
    }
    else if ( error )
      goto Exit;

    /* we have a bdf font: let's construct the face object */
    face->bdffont = font;

    /* BDF cannot have multiple faces in a single font file.
     * XXX: non-zero face_index is already invalid argument, but
     *      Type1, Type42 driver has a convention to return
     *      an invalid argument error when the font could be
     *      opened by the specified driver.
     */
    if ( face_index > 0 && ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "BDF_Face_Init: invalid face index\n" ));
      BDF_Face_Done( bdfface );
      return FT_THROW( Invalid_Argument );
    }

    {
      bdf_property_t*  prop = NULL;


      FT_TRACE4(( "  number of glyphs: allocated %d (used %d)\n",
                  font->glyphs_size,
                  font->glyphs_used ));
      FT_TRACE4(( "  number of unencoded glyphs: allocated %d (used %d)\n",
                  font->unencoded_size,
                  font->unencoded_used ));

      bdfface->num_faces  = 1;
      bdfface->face_index = 0;

      bdfface->face_flags |= FT_FACE_FLAG_FIXED_SIZES |
                             FT_FACE_FLAG_HORIZONTAL  |
                             FT_FACE_FLAG_FAST_GLYPHS;

      prop = bdf_get_font_property( font, "SPACING" );
      if ( prop && prop->format == BDF_ATOM                             &&
           prop->value.atom                                             &&
           ( *(prop->value.atom) == 'M' || *(prop->value.atom) == 'm' ||
             *(prop->value.atom) == 'C' || *(prop->value.atom) == 'c' ) )
        bdfface->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

      /* FZ XXX: TO DO: FT_FACE_FLAGS_VERTICAL   */
      /* FZ XXX: I need a font to implement this */

      prop = bdf_get_font_property( font, "FAMILY_NAME" );
      if ( prop && prop->value.atom )
      {
        if ( FT_STRDUP( bdfface->family_name, prop->value.atom ) )
          goto Exit;
      }
      else
        bdfface->family_name = NULL;

      if ( FT_SET_ERROR( bdf_interpret_style( face ) ) )
        goto Exit;

      /* the number of glyphs (with one slot for the undefined glyph */
      /* at position 0 and all unencoded glyphs)                     */
      bdfface->num_glyphs = (FT_Long)( font->glyphs_size + 1 );

      bdfface->num_fixed_sizes = 1;
      if ( FT_NEW_ARRAY( bdfface->available_sizes, 1 ) )
        goto Exit;

      {
        FT_Bitmap_Size*  bsize = bdfface->available_sizes;
        FT_Short         resolution_x = 0, resolution_y = 0;
        long             value;


        FT_ZERO( bsize );

        /* sanity checks */
        if ( font->font_ascent > 0x7FFF || font->font_ascent < -0x7FFF )
        {
          font->font_ascent = font->font_ascent < 0 ? -0x7FFF : 0x7FFF;
          FT_TRACE0(( "BDF_Face_Init: clamping font ascent to value %d\n",
                      font->font_ascent ));
        }
        if ( font->font_descent > 0x7FFF || font->font_descent < -0x7FFF )
        {
          font->font_descent = font->font_descent < 0 ? -0x7FFF : 0x7FFF;
          FT_TRACE0(( "BDF_Face_Init: clamping font descent to value %d\n",
                      font->font_descent ));
        }

        bsize->height = (FT_Short)( font->font_ascent + font->font_descent );

        prop = bdf_get_font_property( font, "AVERAGE_WIDTH" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative average width\n" ));
#endif
          if ( prop->value.l >    0x7FFFL * 10 - 5   ||
               prop->value.l < -( 0x7FFFL * 10 - 5 ) )
          {
            bsize->width = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping average width to value %d\n",
                        bsize->width ));
          }
          else
            bsize->width = FT_ABS( (FT_Short)( ( prop->value.l + 5 ) / 10 ) );
        }
        else
        {
          /* this is a heuristical value */
          bsize->width = (FT_Short)FT_MulDiv( bsize->height, 2, 3 );
        }

        prop = bdf_get_font_property( font, "POINT_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative point size\n" ));
#endif
          /* convert from 722.7 decipoints to 72 points per inch */
          if ( prop->value.l >  0x504C2L || /* 0x7FFF * 72270/7200 */
               prop->value.l < -0x504C2L )
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping point size to value %d\n",
                        bsize->size ));
          }
          else
            bsize->size = FT_MulDiv( FT_ABS( prop->value.l ),
                                     64 * 7200,
                                     72270L );
        }
        else if ( font->point_size )
        {
          if ( font->point_size > 0x7FFF )
          {
            bsize->size = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping point size to value %d\n",
                        bsize->size ));
          }
          else
            bsize->size = (FT_Pos)font->point_size << 6;
        }
        else
        {
          /* this is a heuristical value */
          bsize->size = bsize->width * 64;
        }

        prop = bdf_get_font_property( font, "PIXEL_SIZE" );
        if ( prop )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( prop->value.l < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative pixel size\n" ));
#endif
          if ( prop->value.l > 0x7FFF || prop->value.l < -0x7FFF )
          {
            bsize->y_ppem = 0x7FFF << 6;
            FT_TRACE0(( "BDF_Face_Init: clamping pixel size to value %d\n",
                        bsize->y_ppem ));
          }
          else
            bsize->y_ppem = FT_ABS( (FT_Short)prop->value.l ) << 6;
        }

        prop = bdf_get_font_property( font, "RESOLUTION_X" );
        if ( prop )
          value = prop->value.l;
        else
          value = (long)font->resolution_x;
        if ( value )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( value < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative X resolution\n" ));
#endif
          if ( value > 0x7FFF || value < -0x7FFF )
          {
            resolution_x = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping X resolution to value %d\n",
                        resolution_x ));
          }
          else
            resolution_x = FT_ABS( (FT_Short)value );
        }

        prop = bdf_get_font_property( font, "RESOLUTION_Y" );
        if ( prop )
          value = prop->value.l;
        else
          value = (long)font->resolution_y;
        if ( value )
        {
#ifdef FT_DEBUG_LEVEL_TRACE
          if ( value < 0 )
            FT_TRACE0(( "BDF_Face_Init: negative Y resolution\n" ));
#endif
          if ( value > 0x7FFF || value < -0x7FFF )
          {
            resolution_y = 0x7FFF;
            FT_TRACE0(( "BDF_Face_Init: clamping Y resolution to value %d\n",
                        resolution_y ));
          }
          else
            resolution_y = FT_ABS( (FT_Short)value );
        }

        if ( bsize->y_ppem == 0 )
        {
          bsize->y_ppem = bsize->size;
          if ( resolution_y )
            bsize->y_ppem = FT_MulDiv( bsize->y_ppem, resolution_y, 72 );
        }
        if ( resolution_x && resolution_y )
          bsize->x_ppem = FT_MulDiv( bsize->y_ppem,
                                     resolution_x,
                                     resolution_y );
        else
          bsize->x_ppem = bsize->y_ppem;
      }

      /* encoding table */
      {
        bdf_glyph_t*   cur = font->glyphs;
        unsigned long  n;


        if ( FT_NEW_ARRAY( face->en_table, font->glyphs_size ) )
          goto Exit;

        face->default_glyph = 0;
        for ( n = 0; n < font->glyphs_size; n++ )
        {
          (face->en_table[n]).enc = cur[n].encoding;
          FT_TRACE4(( "  idx %d, val 0x%lX\n", n, cur[n].encoding ));
          (face->en_table[n]).glyph = (FT_UShort)n;

          if ( cur[n].encoding == font->default_char )
          {
            if ( n < FT_UINT_MAX )
              face->default_glyph = (FT_UInt)n;
            else
              FT_TRACE1(( "BDF_Face_Init:"
                          " idx %d is too large for this system\n", n ));
          }
        }
      }

      /* charmaps */
      {
        bdf_property_t  *charset_registry, *charset_encoding;
        FT_Bool          unicode_charmap  = 0;


        charset_registry =
          bdf_get_font_property( font, "CHARSET_REGISTRY" );
        charset_encoding =
          bdf_get_font_property( font, "CHARSET_ENCODING" );
        if ( charset_registry && charset_encoding )
        {
          if ( charset_registry->format == BDF_ATOM &&
               charset_encoding->format == BDF_ATOM &&
               charset_registry->value.atom         &&
               charset_encoding->value.atom         )
          {
            const char*  s;


            if ( FT_STRDUP( face->charset_encoding,
                            charset_encoding->value.atom ) ||
                 FT_STRDUP( face->charset_registry,
                            charset_registry->value.atom ) )
              goto Exit;

            /* Uh, oh, compare first letters manually to avoid dependency */
            /* on locales.                                                */
            s = face->charset_registry;
            if ( ( s[0] == 'i' || s[0] == 'I' ) &&
                 ( s[1] == 's' || s[1] == 'S' ) &&
                 ( s[2] == 'o' || s[2] == 'O' ) )
            {
              s += 3;
              if ( !ft_strcmp( s, "10646" )                      ||
                   ( !ft_strcmp( s, "8859" ) &&
                     !ft_strcmp( face->charset_encoding, "1" ) ) )
                unicode_charmap = 1;
              /* another name for ASCII */
              else if ( !ft_strcmp( s, "646.1991" )                 &&
                        !ft_strcmp( face->charset_encoding, "IRV" ) )
                unicode_charmap = 1;
            }

            {
              FT_CharMapRec  charmap;


              charmap.face        = FT_FACE( face );
              charmap.encoding    = FT_ENCODING_NONE;
              /* initial platform/encoding should indicate unset status? */
              charmap.platform_id = TT_PLATFORM_APPLE_UNICODE;
              charmap.encoding_id = TT_APPLE_ID_DEFAULT;

              if ( unicode_charmap )
              {
                charmap.encoding    = FT_ENCODING_UNICODE;
                charmap.platform_id = TT_PLATFORM_MICROSOFT;
                charmap.encoding_id = TT_MS_ID_UNICODE_CS;
              }

              error = FT_CMap_New( &bdf_cmap_class, NULL, &charmap, NULL );
            }

            goto Exit;
          }
        }

        /* otherwise assume Adobe standard encoding */

        {
          FT_CharMapRec  charmap;


          charmap.face        = FT_FACE( face );
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.platform_id = TT_PLATFORM_ADOBE;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;

          error = FT_CMap_New( &bdf_cmap_class, NULL, &charmap, NULL );

          /* Select default charmap */
          if ( bdfface->num_charmaps )
            bdfface->charmap = bdfface->charmaps[0];
        }
      }
    }

  Exit:
    return error;

  Fail:
    BDF_Face_Done( bdfface );
    return FT_THROW( Unknown_File_Format );
  }